

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O0

void Eigen::internal::
     triangular_solver_selector<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_2,_0,_-1>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *lhs,Matrix<double,_3,_3,_0,_3,_3> *rhs)

{
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this;
  Index depth;
  Index IVar1;
  Index IVar2;
  Scalar *_tri;
  Scalar *_other;
  Index otherIncr;
  Index otherStride;
  undefined1 local_68 [8];
  BlockingType blocking;
  Index othersize;
  Index size;
  type actualLhs;
  Matrix<double,_3,_3,_0,_3,_3> *rhs_local;
  Matrix<double,__1,__1,_0,__1,__1> *lhs_local;
  
  this = &blas_traits<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::extract(lhs)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
  depth = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  blocking.m_sizeB =
       PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols
                 (&rhs->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>);
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::rows
                    (&rhs->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>);
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols
                    (&rhs->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>);
  gemm_blocking_space<0,_double,_double,_3,_3,_-1,_4,_false>::gemm_blocking_space
            ((gemm_blocking_space<0,_double,_double,_3,_3,__1,_4,_false> *)local_68,IVar1,IVar2,
             depth,1,false);
  IVar1 = blocking.m_sizeB;
  _tri = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef(this,0,0);
  IVar2 = Matrix<double,_-1,_-1,_0,_-1,_-1>::outerStride((Matrix<double,__1,__1,_0,__1,__1> *)this);
  _other = PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::coeffRef
                     (&rhs->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,0,0);
  otherIncr = Matrix<double,_3,_3,_0,_3,_3>::innerStride(rhs);
  otherStride = Matrix<double,_3,_3,_0,_3,_3>::outerStride(rhs);
  triangular_solve_matrix<double,_long,_1,_2,_false,_0,_0,_1>::run
            (depth,IVar1,_tri,IVar2,_other,otherIncr,otherStride,
             (level3_blocking<double,_double> *)local_68);
  gemm_blocking_space<0,_double,_double,_3,_3,_-1,_4,_false>::~gemm_blocking_space
            ((gemm_blocking_space<0,_double,_double,_3,_3,__1,_4,_false> *)local_68);
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC void run(const Lhs& lhs, Rhs& rhs)
  {
    typename internal::add_const_on_value_type<ActualLhsType>::type actualLhs = LhsProductTraits::extract(lhs);

    const Index size = lhs.rows();
    const Index othersize = Side==OnTheLeft? rhs.cols() : rhs.rows();

    typedef internal::gemm_blocking_space<(Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor,Scalar,Scalar,
              Rhs::MaxRowsAtCompileTime, Rhs::MaxColsAtCompileTime, Lhs::MaxRowsAtCompileTime,4> BlockingType;

    BlockingType blocking(rhs.rows(), rhs.cols(), size, 1, false);

    triangular_solve_matrix<Scalar,Index,Side,Mode,LhsProductTraits::NeedToConjugate,(int(Lhs::Flags) & RowMajorBit) ? RowMajor : ColMajor,
                               (Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor, Rhs::InnerStrideAtCompileTime>
      ::run(size, othersize, &actualLhs.coeffRef(0,0), actualLhs.outerStride(), &rhs.coeffRef(0,0), rhs.innerStride(), rhs.outerStride(), blocking);
  }